

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaCom.c
# Opt level: O2

int Cba_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  Cba_Man_t *p;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  Cba_Ntk_t *pCVar9;
  int *pCountP;
  int *pCountU;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  Cba_Ntk_t *pNtk;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  char *pcVar19;
  uint local_44;
  undefined8 local_40;
  
  p = (Cba_Man_t *)pAbc->pAbcCba;
  local_40 = 0;
  Extra_UtilGetoptReset();
  bVar3 = false;
  bVar4 = false;
  local_44 = 0;
  uVar13 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while (iVar5 = Extra_UtilGetopt(argc,argv,"Mmadvh"), iVar14 = globalUtilOptind,
                iVar5 == 0x76) {
            uVar13 = uVar13 ^ 1;
          }
          if (iVar5 == -1) {
            if (p == (Cba_Man_t *)0x0) {
              Abc_Print(1,"Cba_CommandPs(): There is no current design.\n");
              return 0;
            }
            if ((int)local_40 != 0) {
              pCVar9 = Cba_ManRoot(p);
              sVar17 = (long)(p->vNtks).nSize << 2;
              pCountP = (int *)malloc(sVar17);
              memset(pCountP,0xff,sVar17);
              pCountU = (int *)malloc(sVar17);
              memset(pCountU,0xff,sVar17);
              Cba_ManBoxNumRec_rec(pCVar9,pCountP,pCountU);
              uVar13 = pCountP[pCVar9->Id];
              uVar1 = pCountU[pCVar9->Id];
              free(pCountP);
              free(pCountU);
              iVar14 = 0;
              printf("%-12s : ",p->pName);
              printf("pi =%5d  ",(ulong)(uint)(pCVar9->vInputs).nSize);
              printf("po =%5d  ",(ulong)(uint)(pCVar9->vOutputs).nSize);
              printf("mod =%5d  ",(ulong)((p->vNtks).nSize - 1));
              printf("box =%5d  ",(ulong)(uVar1 + uVar13));
              printf("prim =%5d  ",(ulong)uVar13);
              printf("user =%5d  ",(ulong)uVar1);
              if (p->pName == (char *)0x0) {
                iVar5 = 0x658;
              }
              else {
                sVar17 = strlen(p->pName);
                iVar5 = (int)sVar17 + 0x658;
              }
              if (p->pSpec != (char *)0x0) {
                sVar17 = strlen(p->pSpec);
                iVar14 = (int)sVar17;
              }
              iVar6 = Abc_NamMemUsed(p->pStrs);
              iVar7 = Abc_NamMemUsed(p->pFuns);
              iVar8 = Abc_NamMemUsed(p->pMods);
              iVar14 = iVar6 + iVar14 + iVar5 + iVar8 + iVar7 + (p->vOut).nCap + (p->vOut2).nCap +
                       (int)((double)(p->vUsed).nCap * 4.0 + 16.0) +
                       (int)((double)(p->vNtks).nCap * 8.0 + 16.0) +
                       (int)((double)(p->vNameMap).nCap * 4.0 + 16.0) + 0x20;
              for (lVar11 = 1; lVar11 < (p->vNtks).nSize; lVar11 = lVar11 + 1) {
                pvVar2 = (p->vNtks).pArray[lVar11];
                iVar14 = iVar14 + *(int *)((long)pvVar2 + 0x58) +
                         (int)((double)*(int *)((long)pvVar2 + 0x1a0) * 4.0 + 16.0) * 2 +
                         (int)((double)*(int *)((long)pvVar2 + 0x178) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x98) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x118) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x48) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0xd8) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x78) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0xf8) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x28) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0xb8) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x88) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x108) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x38) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 200) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x68) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0xe8) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x18) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0xa8) * 4.0 + 16.0) + 0x1c0 +
                         (int)((double)*(int *)((long)pvVar2 + 0x158) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x138) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x148) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x128) * 4.0 + 16.0) +
                         (int)((double)*(int *)((long)pvVar2 + 0x168) * 4.0 + 16.0);
              }
              printf("mem =%6.3f MB",SUB84((double)iVar14 * 9.5367431640625e-07,0));
              putchar(10);
              uVar16 = 1;
              while( true ) {
                if ((long)(p->vNtks).nSize <= (long)uVar16) {
                  return 0;
                }
                if (uVar16 == (int)local_40 + 1) break;
                pCVar9 = (Cba_Ntk_t *)(p->vNtks).pArray[uVar16];
                uVar18 = 0;
                printf("Module %5d : ",uVar16 & 0xffffffff);
                printf("pi =%5d  ",(ulong)(uint)(pCVar9->vInputs).nSize);
                printf("po =%5d  ",(ulong)(uint)(pCVar9->vOutputs).nSize);
                printf("seq =%5d  ",(ulong)(uint)(pCVar9->vSeq).nSize);
                printf("box =%5d  ",
                       (ulong)(uint)(~((pCVar9->vOutputs).nSize + (pCVar9->vInputs).nSize) +
                                    (pCVar9->vObjType).nSize));
                uVar13 = (pCVar9->vObjType).nSize;
                uVar10 = (ulong)uVar13;
                if ((int)uVar13 < 1) {
                  uVar10 = uVar18;
                }
                uVar15 = 0;
                for (; uVar10 != uVar18; uVar18 = uVar18 + 1) {
                  uVar15 = (ulong)((int)uVar15 + (uint)('\x03' < (pCVar9->vObjType).pArray[uVar18]))
                  ;
                }
                uVar18 = 0;
                printf("prim =%5d  ",uVar15);
                uVar13 = (pCVar9->vObjType).nSize;
                uVar10 = (ulong)uVar13;
                if ((int)uVar13 < 1) {
                  uVar10 = uVar18;
                }
                uVar15 = 0;
                for (; uVar10 != uVar18; uVar18 = uVar18 + 1) {
                  uVar15 = (ulong)((int)uVar15 + (uint)((pCVar9->vObjType).pArray[uVar18] == '\x03')
                                  );
                }
                printf("user =%5d  ",uVar15);
                Cba_NtkName(pCVar9);
                printf("  %s ");
                if ((pCVar9->vNtkObjs).nSize != 0) {
                  uVar13 = Vec_IntEntry(&pCVar9->vNtkObjs,0);
                  if (((int)uVar13 < 1) || ((pCVar9->pDesign->vNtks).nSize <= (int)uVar13)) {
                    pCVar9 = (Cba_Ntk_t *)0x0;
                  }
                  else {
                    pCVar9 = (Cba_Ntk_t *)(pCVar9->pDesign->vNtks).pArray[uVar13];
                  }
                  pcVar12 = Cba_NtkName(pCVar9);
                  printf("-> %s",pcVar12);
                }
                putchar(10);
                uVar16 = uVar16 + 1;
              }
              return 0;
            }
            pCVar9 = Cba_ManRoot(p);
            Cba_NtkPrintStatsFull(pCVar9,local_44,uVar13);
            if (bVar3) {
              pCVar9 = Cba_ManRoot(p);
              Cba_NtkPrintNodes(pCVar9,0x31);
            }
            if (!bVar4) {
              return 0;
            }
            pCVar9 = Cba_ManRoot(p);
            Cba_NtkPrintNodes(pCVar9,0x2f);
            return 0;
          }
          if (iVar5 != 0x6d) break;
          bVar3 = (bool)(bVar3 ^ 1);
        }
        if (iVar5 != 0x61) break;
        bVar4 = (bool)(bVar4 ^ 1);
      }
      if (iVar5 != 100) break;
      local_44 = local_44 ^ 1;
    }
    if (iVar5 != 0x4d) goto LAB_002dc8ce;
    if (argc <= globalUtilOptind) break;
    iVar5 = atoi(argv[globalUtilOptind]);
    local_40 = CONCAT44(extraout_var,iVar5);
    globalUtilOptind = iVar14 + 1;
    if (iVar5 < 0) {
LAB_002dc8ce:
      Abc_Print(-2,"usage: @ps [-M num] [-madvh]\n");
      Abc_Print(-2,"\t         prints statistics\n");
      Abc_Print(-2,"\t-M num : the number of first modules to report [default = %d]\n",local_40);
      pcVar19 = "yes";
      pcVar12 = "yes";
      if (!bVar3) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle printing multipliers [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (!bVar4) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle printing adders [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (local_44 == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle printing distrubition [default = %s]\n",pcVar12);
      if (uVar13 == 0) {
        pcVar19 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar19);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
  goto LAB_002dc8ce;
}

Assistant:

int Cba_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cba_Man_t * p = Cba_AbcGetMan(pAbc);
    int nModules     = 0;
    int fShowMulti   = 0;
    int fShowAdder   = 0;
    int fDistrib     = 0;
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Mmadvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nModules = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nModules < 0 )
                goto usage;
            break;
        case 'm':
            fShowMulti ^= 1;
            break;
        case 'a':
            fShowAdder ^= 1;
            break;
        case 'd':
            fDistrib ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Cba_CommandPs(): There is no current design.\n" );
        return 0;
    }
    if ( nModules )
    {
        Cba_ManPrintStats( p, nModules, fVerbose );
        return 0;
    }
    Cba_NtkPrintStatsFull( Cba_ManRoot(p), fDistrib, fVerbose );
    if ( fShowMulti )
        Cba_NtkPrintNodes( Cba_ManRoot(p), CBA_BOX_MUL );
    if ( fShowAdder )
        Cba_NtkPrintNodes( Cba_ManRoot(p), CBA_BOX_ADD );
    return 0;
usage:
    Abc_Print( -2, "usage: @ps [-M num] [-madvh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-M num : the number of first modules to report [default = %d]\n", nModules );
    Abc_Print( -2, "\t-m     : toggle printing multipliers [default = %s]\n",         fShowMulti? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle printing adders [default = %s]\n",              fShowAdder? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle printing distrubition [default = %s]\n",        fDistrib? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}